

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnRefNullExpr
          (ExprVisitorDelegate *this,RefNullExpr *expr)

{
  Enum EVar1;
  WatWriter *this_00;
  char *s;
  Info local_68;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::RefNull_Opcode);
  WritePuts(this_00,local_68.name,Space);
  EVar1 = (expr->type).enum_;
  if (EVar1 < ExternRef) {
    if (EVar1 == Array) {
      s = "array";
      goto LAB_0013d581;
    }
    if (EVar1 == Struct) {
      s = "struct";
      goto LAB_0013d581;
    }
  }
  else {
    if (EVar1 == FuncRef) {
      s = "func";
      goto LAB_0013d581;
    }
    if (EVar1 == ExternRef) {
      s = "extern";
      goto LAB_0013d581;
    }
  }
  s = "<invalid>";
LAB_0013d581:
  WritePuts(this->writer_,s,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnRefNullExpr(RefNullExpr* expr) {
  writer_->WritePutsSpace(Opcode::RefNull_Opcode.GetName());
  writer_->WriteRefKind(expr->type, NextChar::Newline);
  return Result::Ok;
}